

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O0

rar_program_code * compile_program(uint8_t *bytes,size_t length)

{
  uint32_t uVar1;
  uLong uVar2;
  uint8_t *puVar3;
  ulong local_60;
  size_t i;
  uint8_t xor;
  rar_program_code *prog;
  memory_bit_reader br;
  size_t length_local;
  uint8_t *bytes_local;
  
  br._32_8_ = length;
  memset(&prog,0,0x28);
  i._7_1_ = 0;
  for (local_60 = 1; local_60 < (ulong)br._32_8_; local_60 = local_60 + 1) {
    i._7_1_ = i._7_1_ ^ bytes[local_60];
  }
  if ((br._32_8_ == 0) || (i._7_1_ != *bytes)) {
    bytes_local = (uint8_t *)0x0;
  }
  else {
    br.bytes = (uint8_t *)br._32_8_;
    br.length = 1;
    prog = (rar_program_code *)bytes;
    bytes_local = (uint8_t *)calloc(1,0x38);
    if ((rar_program_code *)bytes_local == (rar_program_code *)0x0) {
      bytes_local = (uint8_t *)0x0;
    }
    else {
      uVar2 = cm_zlib_z_crc32(0,bytes,br.available);
      ((rar_program_code *)bytes_local)->fingerprint = uVar2 | br._32_8_ << 0x20;
      uVar1 = membr_bits((memory_bit_reader *)&prog,1);
      if (uVar1 != 0) {
        uVar1 = membr_next_rarvm_number((memory_bit_reader *)&prog);
        ((rar_program_code *)bytes_local)->staticdatalen = uVar1 + 1;
        puVar3 = (uint8_t *)malloc((ulong)((rar_program_code *)bytes_local)->staticdatalen);
        ((rar_program_code *)bytes_local)->staticdata = puVar3;
        if (((rar_program_code *)bytes_local)->staticdata == (uint8_t *)0x0) {
          delete_program_code((rar_program_code *)bytes_local);
          bytes_local = (uint8_t *)0x0;
        }
        else {
          for (local_60 = 0; local_60 < ((rar_program_code *)bytes_local)->staticdatalen;
              local_60 = local_60 + 1) {
            uVar1 = membr_bits((memory_bit_reader *)&prog,8);
            ((rar_program_code *)bytes_local)->staticdata[local_60] = (uint8_t)uVar1;
          }
        }
      }
    }
  }
  return (rar_program_code *)bytes_local;
}

Assistant:

static struct rar_program_code *
compile_program(const uint8_t *bytes, size_t length)
{
  struct memory_bit_reader br = { 0 };
  struct rar_program_code *prog;
  // uint32_t instrcount = 0;
  uint8_t xor;
  size_t i;

  xor = 0;
  for (i = 1; i < length; i++)
    xor ^= bytes[i];
  if (!length || xor != bytes[0])
    return NULL;

  br.bytes = bytes;
  br.length = length;
  br.offset = 1;

  prog = calloc(1, sizeof(*prog));
  if (!prog)
    return NULL;
  prog->fingerprint = crc32(0, bytes, length) | ((uint64_t)length << 32);

  if (membr_bits(&br, 1))
  {
    prog->staticdatalen = membr_next_rarvm_number(&br) + 1;
    prog->staticdata = malloc(prog->staticdatalen);
    if (!prog->staticdata)
    {
      delete_program_code(prog);
      return NULL;
    }
    for (i = 0; i < prog->staticdatalen; i++)
      prog->staticdata[i] = (uint8_t)membr_bits(&br, 8);
  }

  return prog;
}